

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermediate.h
# Opt level: O0

void __thiscall
glslang::TIntermTraverser::TIntermTraverser
          (TIntermTraverser *this,bool preVisit,bool inVisit,bool postVisit,bool rightToLeft)

{
  bool rightToLeft_local;
  bool postVisit_local;
  bool inVisit_local;
  bool preVisit_local;
  TIntermTraverser *this_local;
  
  this->_vptr_TIntermTraverser = (_func_int **)&PTR__TIntermTraverser_013aa0b0;
  this->preVisit = preVisit;
  this->inVisit = inVisit;
  this->postVisit = postVisit;
  this->rightToLeft = rightToLeft;
  this->depth = 0;
  this->maxDepth = 0;
  TVector<TIntermNode_*>::TVector(&this->path);
  return;
}

Assistant:

TIntermTraverser(bool preVisit = true, bool inVisit = false, bool postVisit = false, bool rightToLeft = false) :
            preVisit(preVisit),
            inVisit(inVisit),
            postVisit(postVisit),
            rightToLeft(rightToLeft),
            depth(0),
            maxDepth(0) { }